

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Vec_Wrd_t * Mf_ManTruthCollect(int Limit)

{
  word wVar1;
  int iVar2;
  uint uVar3;
  ulong local_70;
  int local_60;
  int local_5c;
  int k;
  int c;
  int p;
  int i;
  word tTemp2;
  word tTemp1;
  word tCur;
  word uTruth;
  Vec_Wrd_t *vResult;
  Vec_Wrd_t *vTruths;
  int *pComp;
  int *pPerm;
  int Limit_local;
  
  pPerm._4_4_ = Limit;
  pComp = Extra_PermSchedule(6);
  vTruths = (Vec_Wrd_t *)Extra_GreyCodeSchedule(6);
  vResult = Mpm_ManGetTruthWithCnf(pPerm._4_4_);
  uTruth = (word)Vec_WrdAlloc(0x100000);
  local_60 = 0;
  do {
    iVar2 = Vec_WrdSize(vResult);
    if (iVar2 <= local_60) {
      if (pComp != (int *)0x0) {
        free(pComp);
        pComp = (int *)0x0;
      }
      if (vTruths != (Vec_Wrd_t *)0x0) {
        free(vTruths);
        vTruths = (Vec_Wrd_t *)0x0;
      }
      uVar3 = Vec_WrdSize(vResult);
      printf("Original = %d.  ",(ulong)uVar3);
      Vec_WrdFree(vResult);
      uVar3 = Vec_WrdSize((Vec_Wrd_t *)uTruth);
      printf("Total = %d.  ",(ulong)uVar3);
      vResult = Vec_WrdUniqifyHash((Vec_Wrd_t *)uTruth,1);
      Vec_WrdFree((Vec_Wrd_t *)uTruth);
      uVar3 = Vec_WrdSize(vResult);
      printf("Unique = %d.  ",(ulong)uVar3);
      for (local_60 = 0; iVar2 = Vec_WrdSize(vResult), local_60 < iVar2; local_60 = local_60 + 1) {
        tCur = Vec_WrdEntry(vResult,local_60);
        Mf_ManTruthCanonicize(&tCur,6);
        Vec_WrdWriteEntry(vResult,local_60,tCur);
      }
      uTruth = (word)Vec_WrdUniqifyHash(vResult,1);
      Vec_WrdFree(vResult);
      uVar3 = Vec_WrdSize((Vec_Wrd_t *)uTruth);
      printf("Unique = %d.  \n",(ulong)uVar3);
      return (Vec_Wrd_t *)uTruth;
    }
    tCur = Vec_WrdEntry(vResult,local_60);
    for (c = 0; c < 2; c = c + 1) {
      if (c == 0) {
        local_70 = tCur;
      }
      else {
        local_70 = tCur ^ 0xffffffffffffffff;
      }
      tTemp1 = local_70;
      for (k = 0; wVar1 = tTemp1, k < 0x2d0; k = k + 1) {
        for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 1) {
          tTemp1 = Abc_Tt6Flip(tTemp1,(&vTruths->nCap)[local_5c]);
          Vec_WrdPush((Vec_Wrd_t *)uTruth,tTemp1);
        }
        if (wVar1 != tTemp1) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                        ,0xad,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
        }
        tTemp1 = Abc_Tt6SwapAdjacent(tTemp1,pComp[k]);
      }
      if (local_70 != tTemp1) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                      ,0xb0,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Mf_ManTruthCollect( int Limit )
{
    extern Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit );
    int * pPerm = Extra_PermSchedule( 6 );
    int * pComp = Extra_GreyCodeSchedule( 6 );
    Vec_Wrd_t * vTruths = Mpm_ManGetTruthWithCnf( Limit );
    Vec_Wrd_t * vResult = Vec_WrdAlloc( 1 << 20 );
    word uTruth, tCur, tTemp1, tTemp2;
    int i, p, c, k;
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        for ( i = 0; i < 2; i++ )
        {
            tCur = i ? ~uTruth : uTruth;
            tTemp1 = tCur;
            for ( p = 0; p < 720; p++ )
            {
                tTemp2 = tCur;
                for ( c = 0; c < 64; c++ )
                {
                    tCur = Abc_Tt6Flip( tCur, pComp[c] );
                    Vec_WrdPush( vResult, tCur );
                }
                assert( tTemp2 == tCur );
                tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
            }
            assert( tTemp1 == tCur );
        }
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    printf( "Original = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    printf( "Total = %d.  ", Vec_WrdSize(vResult) );
    vTruths = Vec_WrdUniqifyHash( vResult, 1 );
    Vec_WrdFree( vResult );
    printf( "Unique = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        Mf_ManTruthCanonicize( &uTruth, 6 );
        Vec_WrdWriteEntry( vTruths, k, uTruth );
    }
    vResult = Vec_WrdUniqifyHash( vTruths, 1 );
    Vec_WrdFree( vTruths );
    printf( "Unique = %d.  \n", Vec_WrdSize(vResult) );
    return vResult;
}